

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

void apx_allocator_start(apx_allocator_t *self)

{
  int iVar1;
  
  if ((self != (apx_allocator_t *)0x0) && (self->workerThreadValid == false)) {
    self->isRunning = true;
    self->workerThreadValid = true;
    iVar1 = pthread_create(&self->workerThread,(pthread_attr_t *)0x0,threadTask,self);
    if (iVar1 != 0) {
      self->workerThreadValid = false;
    }
  }
  return;
}

Assistant:

void apx_allocator_start(apx_allocator_t *self)
{
#ifndef UNIT_TEST
   if( (self != 0) && (self->workerThreadValid == false) )
   {
      apx_allocator_startThread(self);
   }
#else
   (void)self;
#endif
}